

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O0

ByteMaskType * __thiscall
findstr::make_unicode_bytemask
          (ByteMaskType *__return_storage_ptr__,findstr *this,ByteMaskType *bm,int size)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  value_type_conflict3 local_72 [22];
  uint local_5c;
  undefined1 local_58 [4];
  uint i;
  ByteVector mask;
  ByteVector data;
  int size_local;
  ByteMaskType *bm_local;
  findstr *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  local_5c = 0;
  while( true ) {
    uVar1 = (ulong)local_5c;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&bm->first);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&bm->first,(ulong)local_5c);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,pvVar3);
    local_72[5] = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_72 + 5);
    if (size == 4) {
      local_72[4] = 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_72 + 4);
      local_72[3] = 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_72 + 3);
    }
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&bm->second,(ulong)local_5c);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,pvVar3);
    local_72[2] = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,local_72 + 2);
    if (size == 4) {
      local_72[1] = 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,local_72 + 1);
      local_72[0] = '\0';
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,local_72);
    }
    local_5c = local_5c + 1;
  }
  std::
  make_pair<std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
            (__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

ByteMaskType make_unicode_bytemask(const ByteMaskType& bm, int size)
    {
        ByteVector data;
        ByteVector mask;
        for (unsigned i = 0 ; i < bm.first.size() ; i++)
        {
            data.push_back(bm.first[i]);
            data.push_back(0);
            if (size == 4) {
                data.push_back(0);
                data.push_back(0);
            }
            mask.push_back(bm.second[i]);
            mask.push_back(0);
            if (size == 4) {
                mask.push_back(0);
                mask.push_back(0);
            }
        }
        return std::make_pair(data, mask);
    }